

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

void __thiscall http::Page::PageOK(Page *this,char *mimeType)

{
  ostream *poVar1;
  ostream *out;
  char *mimeType_local;
  Page *this_local;
  
  this->HTTPHeaderSent = true;
  poVar1 = get_output_stream(this);
  std::operator<<(poVar1,"HTTP/1.0 200 OK\r\nContent-type: ");
  std::operator<<(poVar1,mimeType);
  std::operator<<(poVar1,"\r\n\r\n");
  return;
}

Assistant:

void http::Page::PageOK(const char* mimeType)
{
    HTTPHeaderSent = true;
    std::ostream& out = get_output_stream();
    out << "HTTP/1.0 200 OK\r\nContent-type: ";
    out << mimeType;
    out << "\r\n\r\n";
}